

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v9::detail::
         do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char,fmt::v9::detail::digit_grouping<char>>
                   (appender out,decimal_fp<float> *f,basic_format_specs<char> *specs,
                   float_specs fspecs,locale_ref loc)

{
  char cVar1;
  numpunct *pnVar2;
  long lVar3;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> bVar4;
  appender aVar5;
  int iVar6;
  size_t sVar7;
  char *pcVar8;
  uint uVar9;
  ulong uVar10;
  char *pcVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  char decimal_point;
  sign_t sign;
  char zero;
  bool pointy;
  int significand_size;
  significand_type significand;
  int exp;
  digit_grouping<char> grouping;
  anon_class_28_8_ad0ecca5 write;
  undefined1 local_cf [31];
  digit_grouping<char> local_b0;
  decimal_fp<float> *local_88;
  anon_class_72_9_0c6a3a8a local_80;
  _Alloc_hider local_38;
  
  local_cf._11_4_ = f->significand;
  uVar9 = 0x1f;
  if ((local_cf._11_4_ | 1) != 0) {
    for (; (local_cf._11_4_ | 1) >> uVar9 == 0; uVar9 = uVar9 - 1) {
    }
  }
  uVar10 = (ulong)(uint)local_cf._11_4_ +
           *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar9 * 8);
  local_cf._7_4_ = (undefined4)(uVar10 >> 0x20);
  local_cf[2] = 0x30;
  local_cf[1] = fspecs._5_1_;
  local_38._M_p = (pointer)fspecs;
  if ((long)uVar10 < 0) {
LAB_00111153:
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
                ,0x199,"negative value");
  }
  lVar16 = ((uVar10 >> 0x20) + 1) - (ulong)(local_cf[1] == '\0');
  cVar1 = '.';
  uVar9 = fspecs._4_4_;
  local_cf._15_8_ = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  if ((uVar9 >> 0x11 & 1) != 0) {
    local_88 = f;
    if (loc.locale_ == (void *)0x0) {
      std::locale::locale((locale *)&local_80);
    }
    else {
      std::locale::locale((locale *)&local_80,(locale *)loc.locale_);
    }
    pnVar2 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)&local_80);
    cVar1 = (**(code **)(*(long *)pnVar2 + 0x10))(pnVar2);
    std::locale::~locale((locale *)&local_80);
    f = local_88;
  }
  uVar12 = f->exponent;
  iVar13 = local_cf._7_4_ + uVar12;
  iVar6 = fspecs.precision;
  local_cf[0] = cVar1;
  if (fspecs._4_1_ == '\x01') {
LAB_00110eae:
    iVar15 = uVar12 + local_cf._7_4_ + -1;
    if ((uVar9 >> 0x13 & 1) == 0) {
      uVar10 = 0;
      if (local_cf._7_4_ == 1) {
        local_cf[0] = '\0';
        uVar10 = 0;
      }
    }
    else {
      uVar10 = 0;
      if (0 < iVar6 - local_cf._7_4_) {
        uVar10 = (ulong)(uint)(iVar6 - local_cf._7_4_);
      }
      lVar16 = lVar16 + uVar10;
    }
    local_80.sign = (sign_t *)CONCAT71(local_80.sign._1_7_,local_cf[1]);
    local_80.sign = (sign_t *)CONCAT44(local_cf._11_4_,local_80.sign._0_4_);
    local_80.significand._0_5_ = CONCAT14(local_cf[0],local_cf._7_4_);
    local_80.significand_size._0_5_ = CONCAT14(0x30,(int)uVar10);
    local_80.significand_size =
         (int *)(CONCAT26(local_80.significand_size._6_2_,
                          CONCAT15(((uVar9 >> 0x10 & 1) == 0) << 5,local_80.significand_size._0_5_))
                | 0x450000000000);
    local_80.f = (decimal_fp<float> *)CONCAT44(local_80.f._4_4_,iVar15);
    if (0 < specs->width) {
      if (iVar13 < 1) {
        iVar15 = 1 - iVar13;
      }
      lVar3 = 2;
      if (99 < iVar15) {
        lVar3 = (ulong)(999 < iVar15) + 3;
      }
      sVar7 = lVar16 + (3 - (ulong)(local_cf[0] == '\0')) + lVar3;
      aVar5 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_1_&>
                        ((appender)local_cf._15_8_,specs,sVar7,sVar7,
                         (anon_class_28_8_ad0ecca5 *)&local_80);
      return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
             aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    }
    aVar5 = do_write_float<fmt::v9::appender,_fmt::v9::detail::dragonbox::decimal_fp<float>,_char,_fmt::v9::detail::digit_grouping<char>_>
            ::anon_class_28_8_ad0ecca5::operator()
                      ((anon_class_28_8_ad0ecca5 *)&local_80,(iterator)local_cf._15_8_);
    return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
           aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  }
  if (((ulong)fspecs & 0xff00000000) == 0) {
    iVar15 = 0x10;
    if (0 < iVar6) {
      iVar15 = iVar6;
    }
    if ((iVar13 < -3) || (iVar15 < iVar13)) goto LAB_00110eae;
  }
  local_cf._27_4_ = iVar13;
  if ((int)uVar12 < 0) {
    if (iVar13 < 1) {
      iVar15 = -iVar13;
      local_b0.sep_.grouping._M_dataplus._M_p._0_4_ = iVar15;
      if (SBORROW4(iVar6,iVar15) != iVar6 + iVar13 < 0) {
        local_b0.sep_.grouping._M_dataplus._M_p._0_4_ = iVar6;
      }
      if (iVar6 < 0) {
        local_b0.sep_.grouping._M_dataplus._M_p._0_4_ = iVar15;
      }
      if (local_cf._7_4_ != 0) {
        local_b0.sep_.grouping._M_dataplus._M_p._0_4_ = iVar15;
      }
      if (local_cf._7_4_ == 0 && (int)local_b0.sep_.grouping._M_dataplus._M_p == 0) {
        local_cf[3] = (char)((uVar9 & 0x80000) >> 0x13);
        iVar6 = 2 - (uint)(((ulong)fspecs & 0x8000000000000) == 0);
      }
      else {
        local_cf[3] = 1;
        iVar6 = 2;
        if ((int)local_b0.sep_.grouping._M_dataplus._M_p < 0) goto LAB_00111153;
      }
      sVar7 = lVar16 + (ulong)(uint)(iVar6 + (int)local_b0.sep_.grouping._M_dataplus._M_p);
      local_80.sign = local_cf + 1;
      local_80.significand = (significand_type *)(local_cf + 2);
      local_80.significand_size = (int *)(local_cf + 3);
      local_80.f = (decimal_fp<float> *)local_cf;
      local_80.grouping = &local_b0;
      local_80.fspecs = (float_specs *)(local_cf + 0xb);
      local_80.decimal_point = local_cf + 7;
      aVar5 = write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_4_&>
                        ((appender)local_cf._15_8_,specs,sVar7,sVar7,
                         (anon_class_56_7_162c6e41 *)&local_80);
      return (back_insert_iterator<fmt::v9::detail::buffer<char>_>)
             aVar5.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
    }
    uVar14 = 0;
    local_cf._3_4_ = iVar6 - local_cf._7_4_ & (int)(uVar9 << 0xc) >> 0x1f;
    uVar12 = local_cf._3_4_;
    if ((int)local_cf._3_4_ < 1) {
      uVar12 = uVar14;
    }
    digit_grouping<char>::digit_grouping(&local_b0,loc,(bool)((byte)(uVar9 >> 0x11) & 1));
    if (local_b0.sep_.thousands_sep != '\0') {
      pcVar11 = (char *)CONCAT44(local_b0.sep_.grouping._M_dataplus._M_p._4_4_,
                                 (int)local_b0.sep_.grouping._M_dataplus._M_p);
      pcVar8 = pcVar11 + local_b0.sep_.grouping._M_string_length;
      lVar3 = 0;
      do {
        if (pcVar11 == pcVar8) {
          cVar1 = pcVar8[-1];
          pcVar11 = pcVar8;
        }
        else {
          cVar1 = *pcVar11;
          if ((byte)(cVar1 + 0x81U) < 0x82) goto LAB_00111170;
          pcVar11 = pcVar11 + 1;
        }
        uVar14 = uVar14 + (int)cVar1;
        if ((int)local_cf._7_4_ <= (int)uVar14) goto LAB_00111170;
        lVar3 = lVar3 + 1;
      } while( true );
    }
    lVar3 = 0;
LAB_00111170:
    sVar7 = (ulong)uVar12 + lVar16 + lVar3 + 1;
    local_80.sign = local_cf + 1;
    local_80.significand = (significand_type *)(local_cf + 0xb);
    local_80.significand_size = (int *)(local_cf + 7);
    local_80.f = (decimal_fp<float> *)(local_cf + 0x1b);
    local_80.grouping = (digit_grouping<char> *)local_cf;
    local_80.decimal_point = local_cf + 3;
    local_80.num_zeros = (int *)(local_cf + 2);
    local_80.fspecs = (float_specs *)&local_b0;
    bVar4.container =
         (buffer<char> *)
         write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_3_&>
                   ((appender)local_cf._15_8_,specs,sVar7,sVar7,
                    (anon_class_64_8_e6ffa566 *)&local_80);
    goto LAB_001111d0;
  }
  lVar16 = lVar16 + (ulong)uVar12;
  local_cf._3_4_ = iVar6 - iVar13;
  if ((uVar9 >> 0x13 & 1) != 0) {
    lVar16 = lVar16 + 1;
    if (fspecs._4_1_ == '\x02' || 0 < (int)local_cf._3_4_) {
      if ((int)local_cf._3_4_ < 1) goto LAB_00111051;
    }
    else {
      local_cf._3_4_ = 1;
    }
    lVar16 = lVar16 + (ulong)(uint)local_cf._3_4_;
  }
LAB_00111051:
  digit_grouping<char>::digit_grouping(&local_b0,loc,(bool)((byte)(uVar9 >> 0x11) & 1));
  iVar6 = 0;
  if (local_b0.sep_.thousands_sep != '\0') {
    pcVar11 = (char *)CONCAT44(local_b0.sep_.grouping._M_dataplus._M_p._4_4_,
                               (int)local_b0.sep_.grouping._M_dataplus._M_p);
    pcVar8 = pcVar11 + local_b0.sep_.grouping._M_string_length;
    lVar3 = 0;
    do {
      if (pcVar11 == pcVar8) {
        cVar1 = pcVar8[-1];
        pcVar11 = pcVar8;
      }
      else {
        cVar1 = *pcVar11;
        if ((byte)(cVar1 + 0x81U) < 0x82) goto LAB_001110b2;
        pcVar11 = pcVar11 + 1;
      }
      iVar6 = iVar6 + cVar1;
      if (iVar13 <= iVar6) goto LAB_001110b2;
      lVar3 = lVar3 + 1;
    } while( true );
  }
  lVar3 = 0;
LAB_001110b2:
  local_80.sign = local_cf + 1;
  local_80.significand = (significand_type *)(local_cf + 0xb);
  local_80.significand_size = (int *)(local_cf + 7);
  local_80.fspecs = (float_specs *)&local_38;
  local_80.decimal_point = local_cf;
  local_80.num_zeros = (int *)(local_cf + 3);
  local_80.zero = local_cf + 2;
  local_80.f = f;
  local_80.grouping = &local_b0;
  bVar4.container =
       (buffer<char> *)
       write_padded<(fmt::v9::align::type)2,fmt::v9::appender,char,fmt::v9::detail::do_write_float<fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>,char,fmt::v9::detail::digit_grouping<char>>(fmt::v9::appender,fmt::v9::detail::dragonbox::decimal_fp<float>const&,fmt::v9::basic_format_specs<char>const&,fmt::v9::detail::float_specs,fmt::v9::detail::locale_ref)::_lambda(fmt::v9::appender)_2_&>
                 ((appender)local_cf._15_8_,specs,lVar16 + lVar3,lVar16 + lVar3,&local_80);
LAB_001111d0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_b0.sep_.grouping._M_dataplus._M_p._4_4_,
                  (int)local_b0.sep_.grouping._M_dataplus._M_p) != &local_b0.sep_.grouping.field_2)
  {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_b0.sep_.grouping._M_dataplus._M_p._4_4_,
                                (int)local_b0.sep_.grouping._M_dataplus._M_p),
                    local_b0.sep_.grouping.field_2._M_allocated_capacity + 1);
  }
  return (appender)(back_insert_iterator<fmt::v9::detail::buffer<char>_>)bVar4.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}